

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerSettings.cpp
# Opt level: O2

void __thiscall MDIOAnalyzerSettings::MDIOAnalyzerSettings(MDIOAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_02;
  AnalyzerSettingInterfaceChannel *pAVar1;
  ulong uVar2;
  Channel *pCVar3;
  uint uVar4;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MDIOAnalyzerSettings_0010bd70;
  this_00 = &this->mMdioChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar2 = 0xffffffffffffffff;
  Channel::Channel(&this->mMdcChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mMdioChannelInterface;
  this_02 = &this->mMdcChannelInterface;
  (this->mMdioChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mMdcChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"MDIO");
  pCVar3 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_02,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"MDC");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_02->_M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar4 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar4,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMdcChannel,true);
  return;
}

Assistant:

MDIOAnalyzerSettings::MDIOAnalyzerSettings() : mMdioChannel( UNDEFINED_CHANNEL ), mMdcChannel( UNDEFINED_CHANNEL )
{
    mMdioChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdioChannelInterface->SetTitleAndTooltip( "MDIO", "MDIO data bus" );
    mMdioChannelInterface->SetChannel( mMdioChannel );

    mMdcChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mMdcChannelInterface->SetTitleAndTooltip( "MDC", "MDIO clock line " );
    mMdcChannelInterface->SetChannel( mMdcChannel );

    AddInterface( mMdioChannelInterface.get() );
    AddInterface( mMdcChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mMdioChannel, "MDIO", false );
    AddChannel( mMdcChannel, "MDC", false );
}